

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O0

void __thiscall
flow::diagnostics::Report::tokenError<std::__cxx11::string,unsigned_long,unsigned_long,int>
          (Report *this,SourceLocation *sloc,string *f,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          unsigned_long args_1,unsigned_long args_2,int args_3)

{
  string_view format_str;
  basic_string_view<char> local_a0;
  string local_90;
  SourceLocation local_70;
  unsigned_long local_38;
  unsigned_long args_local_2;
  unsigned_long args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  string *f_local;
  SourceLocation *sloc_local;
  Report *this_local;
  
  local_38 = args_2;
  args_local_2 = args_1;
  args_local_1 = (unsigned_long)args;
  args_local = f;
  f_local = &sloc->filename;
  sloc_local = (SourceLocation *)this;
  SourceLocation::SourceLocation(&local_70,sloc);
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>(&local_a0,args_local);
  format_str.size_ = (size_t)args;
  format_str.data_ = (char *)local_a0.size_;
  fmt::v5::format<std::__cxx11::string,unsigned_long,unsigned_long,int>
            (&local_90,(v5 *)local_a0.data_,format_str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_local_2,
             &local_38,(unsigned_long *)&args_3,(int *)this);
  emplace_back(this,TokenError,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  SourceLocation::~SourceLocation(&local_70);
  return;
}

Assistant:

void tokenError(const SourceLocation& sloc, const std::string& f, Args... args) {
    emplace_back(Type::TokenError, sloc, fmt::format(f, std::move(args)...));
  }